

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<std::pair<cs_impl::any,_cs_impl::any>_> * __thiscall
cs::
allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
::alloc<cs::numeric,cs::numeric>
          (allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>,_64UL,_cs_impl::default_allocator_provider>
           *this,numeric *args,numeric *args_1)

{
  long lVar1;
  __int_type _Var2;
  numeric *__args;
  holder<std::pair<cs_impl::any,_cs_impl::any>_> *in_RDX;
  new_allocator<cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>_> *in_RSI;
  numeric *in_RDI;
  holder<std::pair<cs_impl::any,_cs_impl::any>_> *ptr;
  void *pvVar3;
  
  pvVar3 = (void *)0x0;
  if (*(long *)((long)&in_RDI[0x10].data + 8) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDX);
    if (_Var2 == 0) {
      lVar1 = *(long *)((long)&in_RDI[0x10].data + 8);
      *(long *)((long)&in_RDI[0x10].data + 8) = lVar1 + -1;
      __args = *(numeric **)((long)in_RDI + lVar1 * 8 + -8);
      goto LAB_005590c4;
    }
  }
  __args = (numeric *)
           __gnu_cxx::new_allocator<cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>_>::
           allocate(in_RSI,(size_type)in_RDX,pvVar3);
LAB_005590c4:
  __gnu_cxx::new_allocator<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>>::
  construct<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,cs::numeric,cs::numeric>
            (in_RSI,in_RDX,__args,in_RDI);
  return (holder<std::pair<cs_impl::any,_cs_impl::any>_> *)__args;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}